

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-text.c++
# Opt level: O0

void __thiscall
capnp::TextCodec::decode::anon_class_8_1_65350a3f::operator()
          (anon_class_8_1_65350a3f *this,Reader expression)

{
  Builder builder;
  Builder builder_00;
  Reader assignments;
  bool bVar1;
  Orphanage orphanage_00;
  undefined8 in_stack_fffffffffffffeb8;
  Reader local_108;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  BuilderArena *local_a8;
  BuilderArena *local_a0;
  undefined1 local_98 [8];
  ValueTranslator translator;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  BuilderArena *local_48;
  Orphanage orphanage;
  ExternalResolver nullResolver;
  ThrowingErrorReporter errorReporter;
  Fault local_18;
  Fault f;
  anon_class_8_1_65350a3f *this_local;
  
  f.exception = (Exception *)this;
  bVar1 = capnp::compiler::Expression::Reader::isTuple(&expression);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[33]>
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-text.c++"
               ,0x74,FAILED,"expression.isTuple()","\"Input does not contain a struct.\"",
               (char (*) [33])"Input does not contain a struct.");
    kj::_::Debug::Fault::fatal(&local_18);
  }
  anon_unknown.dwarf_14966d::ThrowingErrorReporter::ThrowingErrorReporter
            ((ThrowingErrorReporter *)&nullResolver);
  anon_unknown.dwarf_14966d::ExternalResolver::ExternalResolver
            ((ExternalResolver *)&orphanage.capTable);
  memcpy(&translator.orphanage.capTable,this->output,0x30);
  builder_00.builder.segment = (SegmentBuilder *)local_68;
  builder_00.schema.super_Schema.raw = (Schema)(Schema)uStack_70;
  builder_00.builder.capTable = (CapTableBuilder *)uStack_60;
  builder_00.builder.data = (void *)local_58;
  builder_00.builder.pointers = (WirePointer *)uStack_50;
  builder_00.builder.dataSize = (int)in_stack_fffffffffffffeb8;
  builder_00.builder.pointerCount = (short)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  builder_00.builder._38_2_ = (short)((ulong)in_stack_fffffffffffffeb8 >> 0x30);
  orphanage_00 = Orphanage::getForMessageContaining<capnp::DynamicStruct::Builder>(builder_00);
  local_48 = orphanage_00.arena;
  local_a8 = local_48;
  orphanage.arena = (BuilderArena *)orphanage_00.capTable;
  local_a0 = orphanage.arena;
  capnp::compiler::ValueTranslator::ValueTranslator
            ((ValueTranslator *)local_98,(Resolver *)&orphanage.capTable,
             (ErrorReporter *)&nullResolver,orphanage_00);
  memcpy(&local_d8,this->output,0x30);
  capnp::compiler::Expression::Reader::getTuple(&local_108,&expression);
  builder.builder.segment = (SegmentBuilder *)uStack_d0;
  builder.schema.super_Schema.raw = (Schema)(Schema)local_d8;
  builder.builder.capTable = (CapTableBuilder *)local_c8;
  builder.builder.data = (void *)uStack_c0;
  builder.builder.pointers = (WirePointer *)local_b8;
  builder.builder.dataSize = (undefined4)uStack_b0;
  builder.builder.pointerCount = uStack_b0._4_2_;
  builder.builder._38_2_ = uStack_b0._6_2_;
  assignments.reader.capTable = local_108.reader.capTable;
  assignments.reader.segment = local_108.reader.segment;
  assignments.reader.ptr = local_108.reader.ptr;
  assignments.reader.elementCount = local_108.reader.elementCount;
  assignments.reader.step = local_108.reader.step;
  assignments.reader.structDataSize = local_108.reader.structDataSize;
  assignments.reader.structPointerCount = local_108.reader.structPointerCount;
  assignments.reader.elementSize = local_108.reader.elementSize;
  assignments.reader._39_1_ = local_108.reader._39_1_;
  assignments.reader.nestingLimit = local_108.reader.nestingLimit;
  assignments.reader._44_4_ = local_108.reader._44_4_;
  capnp::compiler::ValueTranslator::fillStructValue((ValueTranslator *)local_98,builder,assignments)
  ;
  return;
}

Assistant:

void TextCodec::decode(kj::StringPtr input, DynamicStruct::Builder output) const {
  lexAndParseExpression(input, [&output](compiler::Expression::Reader expression) {
    KJ_REQUIRE(expression.isTuple(), "Input does not contain a struct.");

    ThrowingErrorReporter errorReporter;
    ExternalResolver nullResolver;

    Orphanage orphanage = Orphanage::getForMessageContaining(output);
    compiler::ValueTranslator translator(nullResolver, errorReporter, orphanage);
    translator.fillStructValue(output, expression.getTuple());
  });
}